

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Print.cpp
# Opt level: O2

void __thiscall
wasm::PrintExpressionContents::visitTableGrow(PrintExpressionContents *this,TableGrow *curr)

{
  string_view str;
  
  str._M_str = "table.grow ";
  str._M_len = 0xb;
  printMedium(this->o,str);
  Name::print(&curr->table,this->o);
  return;
}

Assistant:

void visitTableGrow(TableGrow* curr) {
    printMedium(o, "table.grow ");
    curr->table.print(o);
  }